

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

bool __thiscall Assimp::ASEImporter::GenerateNormals(ASEImporter *this,Mesh *mesh)

{
  bool bVar1;
  reference paVar2;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_38;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_30;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_28;
  const_iterator qq;
  Mesh *mesh_local;
  ASEImporter *this_local;
  
  qq._M_current = (aiVector3t<float> *)mesh;
  bVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                    (&(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals);
  if ((!bVar1) && ((this->configRecomputeNormals & 1U) == 0)) {
    local_30._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   (qq._M_current + 4);
    __gnu_cxx::
    __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
    ::__normal_iterator<aiVector3t<float>*>
              ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                *)&local_28,&local_30);
    while( true ) {
      local_38._M_current =
           (aiVector3t<float> *)
           std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                     (qq._M_current + 4);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
      if (!bVar1) break;
      paVar2 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator*(&local_28);
      if ((paVar2->x != 0.0) || (NAN(paVar2->x))) {
        return true;
      }
      paVar2 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator*(&local_28);
      if (paVar2->y != 0.0) {
        return true;
      }
      if (NAN(paVar2->y)) {
        return true;
      }
      paVar2 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator*(&local_28);
      if (paVar2->z != 0.0) {
        return true;
      }
      if (NAN(paVar2->z)) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
      ::operator++(&local_28);
    }
  }
  ComputeNormalsWithSmoothingsGroups<Assimp::ASE::Face>
            ((MeshWithSmoothingGroups<Assimp::ASE::Face> *)qq._M_current);
  return false;
}

Assistant:

bool ASEImporter::GenerateNormals(ASE::Mesh& mesh)  {

    if (!mesh.mNormals.empty() && !configRecomputeNormals)
    {
        // Check whether there are only uninitialized normals. If there are
        // some, skip all normals from the file and compute them on our own
        for (std::vector<aiVector3D>::const_iterator qq =  mesh.mNormals.begin();qq != mesh.mNormals.end();++qq) {
            if ((*qq).x || (*qq).y || (*qq).z)
            {
                return true;
            }
        }
    }
    // The array is reused.
    ComputeNormalsWithSmoothingsGroups<ASE::Face>(mesh);
    return false;
}